

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::MRTCaseGroup::MRTCase::iterate(MRTCase *this)

{
  code *pcVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 uVar6;
  TestLog *this_00;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  char *pcVar8;
  mapped_type *this_01;
  TestError *this_02;
  MessageBuilder *pMVar9;
  GLSLVersion glslVersion;
  char *local_7a0;
  byte local_789;
  bool local_71d;
  char *local_668;
  RGBA local_650;
  RGBA RStack_64c;
  bool pass;
  MessageBuilder local_648;
  RGBA local_4c4;
  RGBA local_4c0;
  deUint8 local_4bc [4];
  int local_4b8;
  GLubyte result [4];
  int i;
  bool contentsOk;
  bool local_329;
  undefined4 local_328;
  undefined4 uStack_324;
  bool errorOk;
  GLint loc;
  GLuint vao;
  GLuint vbo;
  allocator<char> local_2f1;
  string local_2f0;
  string local_2d0;
  ProgramSources local_2b0;
  undefined1 local_1e0 [8];
  ShaderProgram p;
  FBOSentry fbo;
  string local_f0;
  StringTemplate local_d0;
  undefined1 local_b0 [8];
  string frgSrc;
  key_type local_88;
  undefined1 local_58 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  Functions *gl;
  TestLog *log;
  MRTCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar7->_vptr_RenderContext[3])();
  args._M_t._M_impl.super__Rb_tree_header._M_node_count = CONCAT44(extraout_var,iVar4);
  bVar3 = IsExtensionSupported((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced");
  if (bVar3) {
    if ((iterate()::frgSrcTemplate == '\0') &&
       (iVar4 = __cxa_guard_acquire(&iterate()::frgSrcTemplate), iVar4 != 0)) {
      if (this->m_declarationType == ARRAY) {
        local_668 = iterate::frgSrcTemplateArray;
      }
      else {
        local_668 = iterate::frgSrcTemplateSeparate;
      }
      iterate::frgSrcTemplate = local_668;
      __cxa_guard_release(&iterate()::frgSrcTemplate);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_58);
    pcVar8 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"VERSION_DIRECTIVE",
               (allocator<char> *)(frgSrc.field_2._M_local_buf + 0xf));
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_58,&local_88);
    std::__cxx11::string::operator=((string *)this_01,pcVar8);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)(frgSrc.field_2._M_local_buf + 0xf));
    pcVar8 = iterate::frgSrcTemplate;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,pcVar8,(allocator<char> *)&fbo.field_0x17);
    tcu::StringTemplate::StringTemplate(&local_d0,&local_f0);
    tcu::StringTemplate::specialize
              ((string *)local_b0,&local_d0,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_58);
    tcu::StringTemplate::~StringTemplate(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&fbo.field_0x17);
    FBOSentry::FBOSentry
              ((FBOSentry *)&p.m_program.m_info.linkTimeUs,
               (Functions *)args._M_t._M_impl.super__Rb_tree_header._M_node_count,4,4,0x8058,0x8058)
    ;
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x560))(2,iterate::bufs);
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x1c0))
              (0x3f800000,0x3f800000,0x3f800000);
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x188))(0x4000);
    pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    GetDef2DVtxSrc_abi_cxx11_(&local_2f0,(glcts *)(ulong)this->m_glslVersion,glslVersion);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,pcVar8,&local_2f1);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vbo,pcVar8,(allocator<char> *)((long)&vao + 3));
    glu::makeVtxFragSources(&local_2b0,&local_2d0,(string *)&vbo);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1e0,pRVar7,&local_2b0);
    glu::ProgramSources::~ProgramSources(&local_2b0);
    std::__cxx11::string::~string((string *)&vbo);
    std::allocator<char>::~allocator((allocator<char> *)((long)&vao + 3));
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2f1);
    std::__cxx11::string::~string((string *)&local_2f0);
    bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_1e0);
    if (!bVar3) {
      glu::operator<<(this_00,(ShaderProgram *)local_1e0);
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                 ,0x5cc);
      __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pcVar1 = *(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x1680);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1e0);
    (*pcVar1)(dVar5);
    dVar5 = (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x800))();
    glu::checkError(dVar5,"Program failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x5d0);
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x4e8))(0xbd0);
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x5e0))(0xbe2);
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x100))(0x9297);
    dVar5 = (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x800))();
    glu::checkError(dVar5,"BlendEquation failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x5d6);
    pcVar1 = *(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x15a0);
    pcVar2 = *(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0xb48);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1e0);
    uVar6 = (*pcVar2)(dVar5,"uMultCol");
    (*pcVar1)(0,0,0,0x3f800000,uVar6);
    dVar5 = (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x800))();
    glu::checkError(dVar5,"Uniforms failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x5da);
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x6c8))(1,&loc);
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x40))(0x8892,loc);
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x150))
              (0x8892,0x20,s_pos,0x88e4);
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x708))
              (1,&stack0xfffffffffffffcdc);
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0xd8))(uStack_324);
    pcVar1 = *(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x780);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1e0);
    local_328 = (*pcVar1)(dVar5,"aPos");
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x610))(local_328);
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x19f0))
              (local_328,2,0x1406,0,8,0);
    dVar5 = (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x800))();
    glu::checkError(dVar5,"Attributes failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x5e9);
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x538))(5,0,4);
    iVar4 = (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x800))();
    local_329 = iVar4 == 0x502;
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x568))
              (4,6,0x1403,s_indices);
    local_71d = false;
    if ((local_329 & 1U) != 0) {
      iVar4 = (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x800))();
      local_71d = iVar4 == 0x502;
    }
    local_329 = local_71d;
    if (local_71d == false) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)&i,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&i,
                          (char (*) [46])"DrawArrays/DrawElements didn\'t produce error.");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&i);
    }
    result[3] = '\x01';
    for (local_4b8 = 0; local_4b8 < 2; local_4b8 = local_4b8 + 1) {
      builtin_memcpy(local_4bc,"\x01\x02\x03\x04",4);
      (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x1218))(0x8ce0);
      (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x1220))
                (0,0,1,1,0x1908,0x1401,local_4bc);
      dVar5 = (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x800))();
      glu::checkError(dVar5,"Read pixels failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                      ,0x5fb);
      local_4c0 = tcu::RGBA::fromBytes(local_4bc);
      local_4c4 = tcu::RGBA::white();
      bVar3 = tcu::RGBA::operator!=(&local_4c0,&local_4c4);
      if (bVar3) {
        result[3] = '\0';
        tcu::TestLog::operator<<(&local_648,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<(&local_648,(char (*) [8])0x2c35993);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_4b8);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c6cdd6);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [19])"contents changed: ");
        RStack_64c = tcu::RGBA::fromBytes(local_4bc);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&stack0xfffffffffffff9b4);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [11])0x2ad26ab);
        local_650 = tcu::RGBA::white();
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_650);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_648);
      }
    }
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x490))
              (1,&stack0xfffffffffffffcdc);
    (**(code **)(args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x438))(1,&loc);
    local_789 = 0;
    if ((local_329 & 1U) != 0) {
      local_789 = result[3];
    }
    if ((local_789 & 1) == 0) {
      local_7a0 = "Fail";
    }
    else {
      local_7a0 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)((local_789 & 1) == 0),local_7a0);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1e0);
    FBOSentry::~FBOSentry((FBOSentry *)&p.m_program.m_info.linkTimeUs);
    std::__cxx11::string::~string((string *)local_b0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_58);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  return STOP;
}

Assistant:

MRTCaseGroup::MRTCase::IterateResult MRTCaseGroup::MRTCase::iterate(void)
{
	TestLog&			  log = m_testCtx.getLog();
	const glw::Functions& gl  = m_context.getRenderContext().getFunctions();

	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	static const char* frgSrcTemplateArray = "${VERSION_DIRECTIVE}\n"
											 "#extension GL_KHR_blend_equation_advanced : require\n"
											 "\n"
											 "precision highp float;\n"
											 "layout (blend_support_multiply) out;\n"
											 "layout (location = 0) out vec4 oCol[2];\n"
											 "\n"
											 "uniform vec4 uMultCol;\n"
											 "\n"
											 "void main (void) {\n"
											 "   oCol[0] = uMultCol;\n"
											 "   oCol[1] = uMultCol;\n"
											 "}\n";

	static const char* frgSrcTemplateSeparate = "${VERSION_DIRECTIVE}\n"
												"#extension GL_KHR_blend_equation_advanced : require\n"
												"\n"
												"precision highp float;\n"
												"layout (blend_support_multiply) out;\n"
												"layout (location = 0) out vec4 oCol0;\n"
												"layout (location = 1) out vec4 oCol1;\n"
												"\n"
												"uniform vec4 uMultCol;\n"
												"\n"
												"void main (void) {\n"
												"   oCol0 = uMultCol;\n"
												"   oCol1 = uMultCol;\n"
												"}\n";

	static const char* frgSrcTemplate = m_declarationType == ARRAY ? frgSrcTemplateArray : frgSrcTemplateSeparate;

	std::map<std::string, std::string> args;
	args["VERSION_DIRECTIVE"] = glu::getGLSLVersionDeclaration(m_glslVersion);
	std::string frgSrc		  = tcu::StringTemplate(frgSrcTemplate).specialize(args);

	FBOSentry fbo(gl, 4, 4, GL_RGBA8, GL_RGBA8);

	static const glw::GLenum bufs[2] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };
	gl.drawBuffers(2, bufs);

	// Clear buffers to white.
	gl.clearColor(1.f, 1.f, 1.f, 1.f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	// Setup program.
	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}

	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	// Enable blending and set blend equation.
	gl.disable(GL_DITHER);
	gl.enable(GL_BLEND);
	gl.blendEquation(GL_DARKEN_KHR);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

	// Multiply with zero.
	gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uMultCol"), 0.f, 0.f, 0.f, 1.00f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniforms failed");

	// Set vertex buffer
	glw::GLuint vbo;
	gl.genBuffers(1, &vbo);
	gl.bindBuffer(GL_ARRAY_BUFFER, vbo);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(s_pos), s_pos, GL_STATIC_DRAW);

	// Set vertices.
	glw::GLuint vao;
	gl.genVertexArrays(1, &vao);
	gl.bindVertexArray(vao);
	glw::GLint loc = gl.getAttribLocation(p.getProgram(), "aPos");
	gl.enableVertexAttribArray(loc);
	gl.vertexAttribPointer(loc, 2, GL_FLOAT, GL_FALSE, 8, DE_NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Attributes failed");

	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	bool errorOk = (gl.getError() == GL_INVALID_OPERATION);

	gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, s_indices);
	errorOk = errorOk && (gl.getError() == GL_INVALID_OPERATION);

	if (!errorOk)
		log << TestLog::Message << "DrawArrays/DrawElements didn't produce error." << TestLog::EndMessage;

	// Expect unaltered destination pixels.
	bool contentsOk = true;
	for (int i = 0; i < 2; i++)
	{
		glw::GLubyte result[4] = { 1, 2, 3, 4 };
		gl.readBuffer(bufs[0]);
		gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, result);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");
		if (tcu::RGBA::fromBytes(result) != tcu::RGBA::white())
		{
			contentsOk = false;
			log << TestLog::Message << "Buffer " << i << " "
				<< "contents changed: " << tcu::RGBA::fromBytes(result) << " expected:" << tcu::RGBA::white()
				<< TestLog::EndMessage;
		}
	}

	gl.deleteVertexArrays(1, &vao);
	gl.deleteBuffers(1, &vbo);

	bool pass = errorOk && contentsOk;
	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail");
	return STOP;
}